

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vad_core.c
# Opt level: O1

int WebRtcVad_InitCore(VadInstT *self)

{
  long lVar1;
  
  if (self != (VadInstT *)0x0) {
    self->vad = 1;
    self->downsampling_filter_states[0] = 0;
    self->downsampling_filter_states[1] = 0;
    self->downsampling_filter_states[2] = 0;
    self->downsampling_filter_states[3] = 0;
    self->frame_counter = 0;
    self->over_hang = 0;
    self->num_of_speech = 0;
    WebRtcSpl_ResetResample48khzTo8khz(&self->state_48_to_8);
    self->noise_means[8] = 0x1e8c;
    self->noise_means[9] = 0x1c62;
    self->noise_means[10] = 0x139c;
    self->noise_means[0xb] = 0x110a;
    self->noise_means[0] = 0x1a52;
    self->noise_means[1] = 0x131c;
    self->noise_means[2] = 0x1b99;
    self->noise_means[3] = 0x1a3b;
    self->noise_means[4] = 0x1a73;
    self->noise_means[5] = 0xd29;
    self->noise_means[6] = 0x1dde;
    self->noise_means[7] = 0xf17;
    self->speech_means[8] = 0x2a7f;
    self->speech_means[9] = 0x1d9d;
    self->speech_means[10] = 0x1ff4;
    self->speech_means[0xb] = 0x1d3b;
    self->speech_means[0] = 0x2072;
    self->speech_means[1] = 0x2765;
    self->speech_means[2] = 0x275e;
    self->speech_means[3] = 0x2e2f;
    self->speech_means[4] = 0x2e43;
    self->speech_means[5] = 0x18a5;
    self->speech_means[6] = 0x2501;
    self->speech_means[7] = 0x2563;
    self->noise_stds[8] = 0x1db;
    self->noise_stds[9] = 0x2b0;
    self->noise_stds[10] = 0x1a5;
    self->noise_stds[0xb] = 0x1c7;
    self->noise_stds[0] = 0x17a;
    self->noise_stds[1] = 0x428;
    self->noise_stds[2] = 0x1ed;
    self->noise_stds[3] = 0x246;
    self->noise_stds[4] = 0x2b0;
    self->noise_stds[5] = 0x251;
    self->noise_stds[6] = 0x1da;
    self->noise_stds[7] = 0x2b9;
    self->speech_stds[8] = 0x1ec;
    self->speech_stds[9] = 0x604;
    self->speech_stds[10] = 0x437;
    self->speech_stds[0xb] = 0x352;
    self->speech_stds[0] = 0x22b;
    self->speech_stds[1] = 0x1f9;
    self->speech_stds[2] = 0x237;
    self->speech_stds[3] = 0x20c;
    self->speech_stds[4] = 0x249;
    self->speech_stds[5] = 0x4cf;
    self->speech_stds[6] = 0x1fd;
    self->speech_stds[7] = 0x33c;
    lVar1 = 0;
    memset(self->index_vector,0,0xc0);
    do {
      self->low_value_vector[lVar1] = 10000;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0x60);
    self->lower_state[1] = 0;
    self->lower_state[2] = 0;
    self->lower_state[3] = 0;
    self->lower_state[4] = 0;
    self->hp_filter_state[0] = 0;
    self->hp_filter_state[1] = 0;
    self->hp_filter_state[2] = 0;
    self->hp_filter_state[3] = 0;
    self->upper_state[0] = 0;
    self->upper_state[1] = 0;
    self->upper_state[2] = 0;
    self->upper_state[3] = 0;
    *(undefined8 *)(self->upper_state + 4) = 0;
    lVar1 = 0;
    do {
      self->mean_value[lVar1] = 0x640;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 6);
    self->over_hang_max_1[2] = 3;
    self->over_hang_max_1[0] = 8;
    self->over_hang_max_1[1] = 4;
    self->over_hang_max_2[0] = 0xe;
    self->over_hang_max_2[1] = 7;
    self->over_hang_max_2[2] = 5;
    self->individual[0] = 0x18;
    self->individual[1] = 0x15;
    self->individual[2] = 0x18;
    self->total[0] = 0x39;
    self->total[1] = 0x30;
    self->total[2] = 0x39;
    self->init_flag = 0x2a;
    return 0;
  }
  return -1;
}

Assistant:

int WebRtcVad_InitCore(VadInstT* self) {
  int i;

  if (self == NULL) {
    return -1;
  }

  // Initialization of general struct variables.
  self->vad = 1;  // Speech active (=1).
  self->frame_counter = 0;
  self->over_hang = 0;
  self->num_of_speech = 0;

  // Initialization of downsampling filter state.
  memset(self->downsampling_filter_states, 0,
         sizeof(self->downsampling_filter_states));

  // Initialization of 48 to 8 kHz downsampling.
  WebRtcSpl_ResetResample48khzTo8khz(&self->state_48_to_8);

  // Read initial PDF parameters.
  for (i = 0; i < kTableSize; i++) {
    self->noise_means[i] = kNoiseDataMeans[i];
    self->speech_means[i] = kSpeechDataMeans[i];
    self->noise_stds[i] = kNoiseDataStds[i];
    self->speech_stds[i] = kSpeechDataStds[i];
  }

  // Initialize Index and Minimum value vectors.
  for (i = 0; i < 16 * kNumChannels; i++) {
    self->low_value_vector[i] = 10000;
    self->index_vector[i] = 0;
  }

  // Initialize splitting filter states.
  memset(self->upper_state, 0, sizeof(self->upper_state));
  memset(self->lower_state, 0, sizeof(self->lower_state));

  // Initialize high pass filter states.
  memset(self->hp_filter_state, 0, sizeof(self->hp_filter_state));

  // Initialize mean value memory, for WebRtcVad_FindMinimum().
  for (i = 0; i < kNumChannels; i++) {
    self->mean_value[i] = 1600;
  }

  // Set aggressiveness mode to default (=`kDefaultMode`).
  if (WebRtcVad_set_mode_core(self, kDefaultMode) != 0) {
    return -1;
  }

  self->init_flag = kInitCheck;

  return 0;
}